

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O3

void helper_msa_ld_d_mips64(CPUMIPSState_conflict5 *env,uint32_t wd,target_ulong addr)

{
  uint64_t uVar1;
  TCGMemOpIdx oi;
  uintptr_t unaff_retaddr;
  
  oi = 0x7b3;
  if ((env->hflags >> 0x1c & 1) == 0) {
    oi = env->hflags & 3 | 0x7b0;
  }
  uVar1 = helper_be_ldq_mmu_mips64((CPUArchState_conflict11 *)env,addr,oi,unaff_retaddr);
  (env->active_fpu).fpr[wd].d = uVar1;
  uVar1 = helper_be_ldq_mmu_mips64((CPUArchState_conflict11 *)env,addr + 8,oi,unaff_retaddr);
  *(uint64_t *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 8) = uVar1;
  return;
}

Assistant:

void helper_msa_ld_d(CPUMIPSState *env, uint32_t wd,
                     target_ulong addr)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    MEMOP_IDX(DF_DOUBLE)
    pwd->d[0] = helper_ret_ldq_mmu(env, addr + (0 << DF_DOUBLE), oi, GETPC());
    pwd->d[1] = helper_ret_ldq_mmu(env, addr + (1 << DF_DOUBLE), oi, GETPC());
}